

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleon.h
# Opt level: O0

array<double,_4UL> * __thiscall
trento::NucleonCommon::boundary(NucleonCommon *this,NucleonData *nucleon)

{
  double dVar1;
  bool bVar2;
  pointer pCVar3;
  long in_RSI;
  array<double,_4UL> *in_RDI;
  double dVar4;
  double r;
  double y;
  double x;
  double ymax;
  double ymin;
  double xmax;
  double xmin;
  const_iterator constituent;
  vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
  *in_stack_ffffffffffffff88;
  array<double,_4UL> *__lhs;
  undefined8 in_stack_ffffffffffffffa8;
  int __n;
  __normal_iterator<const_trento::NucleonData::Constituent_*,_std::vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>_>
  *in_stack_ffffffffffffffb0;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  __normal_iterator<const_trento::NucleonData::Constituent_*,_std::vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>_>
  local_18 [3];
  
  __n = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  __lhs = in_RDI;
  local_18[0]._M_current =
       (Constituent *)
       std::
       vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>::
       begin(in_stack_ffffffffffffff88);
  pCVar3 = __gnu_cxx::
           __normal_iterator<const_trento::NucleonData::Constituent_*,_std::vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>_>
           ::operator->(local_18);
  local_20 = pCVar3->x;
  pCVar3 = __gnu_cxx::
           __normal_iterator<const_trento::NucleonData::Constituent_*,_std::vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>_>
           ::operator->(local_18);
  local_28 = pCVar3->x;
  pCVar3 = __gnu_cxx::
           __normal_iterator<const_trento::NucleonData::Constituent_*,_std::vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>_>
           ::operator->(local_18);
  local_30 = pCVar3->y;
  pCVar3 = __gnu_cxx::
           __normal_iterator<const_trento::NucleonData::Constituent_*,_std::vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>_>
           ::operator->(local_18);
  local_38 = pCVar3->y;
  std::
  advance<__gnu_cxx::__normal_iterator<trento::NucleonData::Constituent_const*,std::vector<trento::NucleonData::Constituent,std::allocator<trento::NucleonData::Constituent>>>,int>
            (in_stack_ffffffffffffffb0,__n);
  while( true ) {
    std::vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
    ::end(in_stack_ffffffffffffff88);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_trento::NucleonData::Constituent_*,_std::vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>_>
                        *)__lhs,(__normal_iterator<const_trento::NucleonData::Constituent_*,_std::vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>_>
                                 *)in_stack_ffffffffffffff88);
    if (!bVar2) break;
    pCVar3 = __gnu_cxx::
             __normal_iterator<const_trento::NucleonData::Constituent_*,_std::vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>_>
             ::operator->(local_18);
    dVar4 = pCVar3->x;
    dVar1 = dVar4;
    if ((local_20 <= dVar4) && (dVar1 = local_20, local_28 < dVar4)) {
      local_28 = dVar4;
    }
    local_20 = dVar1;
    pCVar3 = __gnu_cxx::
             __normal_iterator<const_trento::NucleonData::Constituent_*,_std::vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>_>
             ::operator->(local_18);
    dVar4 = pCVar3->y;
    dVar1 = dVar4;
    if ((local_30 <= dVar4) && (dVar1 = local_30, local_38 < dVar4)) {
      local_38 = dVar4;
    }
    local_30 = dVar1;
    __gnu_cxx::
    __normal_iterator<const_trento::NucleonData::Constituent_*,_std::vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>_>
    ::operator++(local_18);
  }
  dVar4 = sqrt(*(double *)(in_RSI + 0x60));
  __lhs->_M_elems[0] = local_20 - dVar4;
  __lhs->_M_elems[1] = local_28 + dVar4;
  __lhs->_M_elems[2] = local_30 - dVar4;
  __lhs->_M_elems[3] = local_38 + dVar4;
  return in_RDI;
}

Assistant:

inline std::array<double, 4>
NucleonCommon::boundary(const NucleonData& nucleon) const {
  auto constituent = nucleon.constituents_.begin();

  // Initialize the boundary with the position of the first constituent.
  auto xmin = constituent->x, xmax = constituent->x;
  auto ymin = constituent->y, ymax = constituent->y;

  // Check the remaining constituents and update the boundary accordingly.
  // Using this instead of something from std::algorithm because it finds all
  // four quantities {xmin, xmax, ymin, ymax} in a single pass over the constituents.
  for (std::advance(constituent, 1); constituent != nucleon.constituents_.end(); ++constituent) {
    auto x = constituent->x;
    if (x < xmin)
      xmin = x;
    else if (x > xmax)
      xmax = x;

    auto y = constituent->y;
    if (y < ymin)
      ymin = y;
    else if (y > ymax)
      ymax = y;
  }

  // Remember to add and subtract the constituent radius.
  auto r = std::sqrt(constituent_radius_sq_);

  return {xmin - r, xmax + r, ymin - r, ymax + r};
}